

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leccalc.cpp
# Opt level: O3

bool operator<(outkey2 *lhs,outkey2 *rhs)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  
  iVar1 = rhs->period_no;
  iVar2 = lhs->period_no;
  bVar4 = SBORROW4(iVar2,iVar1);
  bVar3 = iVar2 - iVar1 < 0;
  if (iVar2 == iVar1) {
    iVar1 = rhs->sidx;
    iVar2 = lhs->sidx;
    bVar4 = SBORROW4(iVar2,iVar1);
    bVar3 = iVar2 - iVar1 < 0;
    if (iVar2 == iVar1) {
      bVar4 = SBORROW4(lhs->summary_id,rhs->summary_id);
      bVar3 = lhs->summary_id - rhs->summary_id < 0;
    }
  }
  return bVar4 != bVar3;
}

Assistant:

bool operator<(const outkey2& lhs, const outkey2& rhs)
{
	if (lhs.period_no != rhs.period_no) {
		return lhs.period_no < rhs.period_no;
	}
	if (lhs.sidx != rhs.sidx) {
		return lhs.sidx < rhs.sidx;
	}
	else {
		return lhs.summary_id < rhs.summary_id;
	}
}